

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O1

void duckdb::AggregateStateFinalize(DataChunk *input,ExpressionState *state_p,Vector *result)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  SelectionVector *pSVar3;
  SelectionVector *pSVar4;
  BoundFunctionExpression *pBVar5;
  pointer pFVar6;
  reference this;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  uint *puVar10;
  Allocator *__dest;
  long lVar11;
  idx_t idx;
  UnifiedVectorFormat state_data;
  AggregateInputData aggr_input_data;
  UnifiedVectorFormat local_90;
  undefined8 local_48;
  buffer_ptr<SelectionData> *local_40;
  undefined1 local_38;
  
  pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&state_p->expr->super_BaseExpression);
  pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar5->bind_info);
  local_90.sel = (SelectionVector *)state_p[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_90);
  pSVar4 = local_90.sel;
  pSVar3 = local_90.sel + 5;
  ArenaAllocator::Reset((ArenaAllocator *)&pSVar3->selection_data);
  pp_Var1 = pFVar6[0x27]._vptr_FunctionData;
  peVar2 = pSVar4[2].selection_data.internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_90);
  this = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  Vector::ToUnifiedFormat(this,input->count,&local_90);
  uVar7 = input->count;
  if (uVar7 != 0) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      uVar7 = uVar9;
      if ((_func_int *)(local_90.sel)->sel_vector != (_func_int *)0x0) {
        uVar7 = (ulong)*(uint *)((long)(local_90.sel)->sel_vector + uVar9 * 4);
      }
      puVar10 = (uint *)(local_90.data + uVar7 * 0x10);
      __dest = (Allocator *)
               ((long)&((pSVar4->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar11);
      if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
LAB_00a21b52:
        if (*puVar10 < 0xd) {
          puVar10 = puVar10 + 1;
        }
        else {
          puVar10 = *(uint **)(puVar10 + 2);
        }
        switchD_00b1522a::default(__dest,puVar10,(size_t)pFVar6[0x27]._vptr_FunctionData);
      }
      else {
        if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6]
             >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00a21b52;
        (*(code *)pFVar6[0x18]._vptr_FunctionData)(pFVar6 + 1,__dest);
      }
      (&(peVar2->owned_data).allocator)[uVar9].ptr = __dest;
      uVar9 = uVar9 + 1;
      uVar7 = input->count;
      lVar11 = lVar11 + ((long)pp_Var1 + 7U & 0xfffffffffffffff8);
    } while (uVar9 < uVar7);
  }
  local_48 = 0;
  local_38 = 1;
  local_40 = &pSVar3->selection_data;
  (*(code *)pFVar6[0x1b]._vptr_FunctionData)(pSVar4 + 1,&local_48,result,uVar7,0);
  if (input->count != 0) {
    idx = 0;
    do {
      iVar8 = idx;
      if ((_func_int *)(local_90.sel)->sel_vector != (_func_int *)0x0) {
        iVar8 = (idx_t)*(uint *)((long)(local_90.sel)->sel_vector + idx * 4);
      }
      if ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) &&
         ((local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar8 >> 6] >>
           (iVar8 & 0x3f) & 1) == 0)) {
        FlatVector::SetNull(result,idx,true);
      }
      idx = idx + 1;
    } while (idx < input->count);
  }
  if (local_90.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void AggregateStateFinalize(DataChunk &input, ExpressionState &state_p, Vector &result) {
	auto &bind_data = ExportAggregateBindData::GetFrom(state_p);
	auto &local_state = ExecuteFunctionState::GetFunctionState(state_p)->Cast<FinalizeState>();
	local_state.allocator.Reset();

	D_ASSERT(bind_data.state_size == bind_data.aggr.state_size(bind_data.aggr));
	D_ASSERT(input.data.size() == 1);
	D_ASSERT(input.data[0].GetType().id() == LogicalTypeId::AGGREGATE_STATE);
	auto aligned_state_size = AlignValue(bind_data.state_size);

	auto state_vec_ptr = FlatVector::GetData<data_ptr_t>(local_state.addresses);

	UnifiedVectorFormat state_data;
	input.data[0].ToUnifiedFormat(input.size(), state_data);
	for (idx_t i = 0; i < input.size(); i++) {
		auto state_idx = state_data.sel->get_index(i);
		auto state_entry = UnifiedVectorFormat::GetData<string_t>(state_data) + state_idx;
		auto target_ptr = char_ptr_cast(local_state.state_buffer.get()) + aligned_state_size * i;

		if (state_data.validity.RowIsValid(state_idx)) {
			D_ASSERT(state_entry->GetSize() == bind_data.state_size);
			memcpy((void *)target_ptr, state_entry->GetData(), bind_data.state_size);
		} else {
			// create a dummy state because finalize does not understand NULLs in its input
			// we put the NULL back in explicitly below
			bind_data.aggr.initialize(bind_data.aggr, data_ptr_cast(target_ptr));
		}
		state_vec_ptr[i] = data_ptr_cast(target_ptr);
	}

	AggregateInputData aggr_input_data(nullptr, local_state.allocator);
	bind_data.aggr.finalize(local_state.addresses, aggr_input_data, result, input.size(), 0);

	for (idx_t i = 0; i < input.size(); i++) {
		auto state_idx = state_data.sel->get_index(i);
		if (!state_data.validity.RowIsValid(state_idx)) {
			FlatVector::SetNull(result, i, true);
		}
	}
}